

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O0

int __thiscall Fl_Browser_::select_only(Fl_Browser_ *this,void *item,int docallbacks)

{
  uchar uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  fd_set *in_R8;
  timeval *in_R9;
  void *local_48;
  void *p;
  Fl_Widget_Tracker local_30;
  Fl_Widget_Tracker wp;
  int change;
  int docallbacks_local;
  void *item_local;
  Fl_Browser_ *this_local;
  
  wp.wp_._4_4_ = docallbacks;
  if (item == (void *)0x0) {
    this_local._4_4_ = deselect(this,docallbacks);
  }
  else {
    wp.wp_._0_4_ = 0;
    Fl_Widget_Tracker::Fl_Widget_Tracker(&local_30,(Fl_Widget *)this);
    uVar1 = Fl_Widget::type((Fl_Widget *)this);
    if (uVar1 == '\x03') {
      iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])();
      local_48 = (void *)CONCAT44(extraout_var,iVar2);
      while (local_48 != (void *)0x0) {
        if (local_48 != item) {
          uVar3 = select(this,(int)local_48,(fd_set *)0x0,(fd_set *)(ulong)wp.wp_._4_4_,in_R8,in_R9)
          ;
          wp.wp_._0_4_ = uVar3 | (uint)wp.wp_;
        }
        iVar2 = Fl_Widget_Tracker::deleted(&local_30);
        if (iVar2 != 0) {
          this_local._4_4_ = (uint)wp.wp_;
          goto LAB_001d7b0c;
        }
        iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,local_48);
        local_48 = (void *)CONCAT44(extraout_var_00,iVar2);
      }
    }
    uVar3 = select(this,(int)item,(fd_set *)&DAT_00000001,(fd_set *)(ulong)wp.wp_._4_4_,in_R8,in_R9)
    ;
    wp.wp_._0_4_ = (uint)wp.wp_ | uVar3;
    iVar2 = Fl_Widget_Tracker::deleted(&local_30);
    if (iVar2 == 0) {
      display(this,item);
      this_local._4_4_ = (uint)wp.wp_;
    }
    else {
      this_local._4_4_ = (uint)wp.wp_;
    }
LAB_001d7b0c:
    wp.wp_._0_4_ = this_local._4_4_;
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_30);
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Browser_::select_only(void* item, int docallbacks) {
  if (!item) return deselect(docallbacks);
  int change = 0;
  Fl_Widget_Tracker wp(this);
  if (type() == FL_MULTI_BROWSER) {
    for (void* p = item_first(); p; p = item_next(p)) {
      if (p != item) change |= select(p, 0, docallbacks);
      if (wp.deleted()) return change;
    }
  }
  change |= select(item, 1, docallbacks);
  if (wp.deleted()) return change;
  display(item);
  return change;
}